

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<unsigned_int&,std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,uint *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  uint *args_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined1 *in_RSI;
  ValidationReport *in_RDI;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  ValidationReport *__args;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  undefined8 local_168;
  allocator<char> *in_stack_fffffffffffffea0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  allocator<char> local_141;
  undefined1 local_140;
  undefined2 local_13e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  ValidationReport VStack_118;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_98;
  undefined1 local_90 [32];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  undefined1 *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  *(int *)&(in_RDI->details)._M_string_length = (int)(in_RDI->details)._M_string_length + 1;
  VStack_118.message.field_2._8_8_ = in_RCX;
  VStack_118.details._0_8_ = in_RDX;
  VStack_118.details._M_string_length = (size_type)in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)&(in_RDI->details).field_0x4 = uVar1;
  psVar2 = &in_RDI->message;
  local_140 = *(undefined1 *)VStack_118.details._M_string_length;
  local_13e = *(undefined2 *)(VStack_118.details._M_string_length + 2);
  args_1_00 = &local_138;
  args_00 = (uint *)(VStack_118.details._M_string_length + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  __args = &VStack_118;
  local_60 = (undefined8 *)(VStack_118.details._M_string_length + 0x18);
  local_58 = &local_168;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(VStack_118.details._M_string_length + 0x20);
  s._M_str = (char *)args_1_00;
  s._M_len = (size_t)psVar2;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            ((basic_string_view<char> *)in_RDI,s);
  local_8 = local_60;
  local_90._8_8_ = local_168;
  local_90._0_8_ = VStack_118.details._0_8_;
  local_98 = VStack_118.message.field_2._8_8_;
  local_50 = local_90 + 8;
  local_90._24_8_ = __args;
  ::fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int,std::__cxx11::string>
            (args_00,args_1_00);
  local_30 = &local_b8;
  local_38 = (undefined1 *)((long)&VStack_118.details.field_2 + 8);
  local_18 = 0xd2;
  local_b8 = 0xd2;
  local_28 = local_38;
  local_20 = local_38;
  local_10 = local_30;
  local_b0 = local_38;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_000000e8,(format_args)in_stack_000000d8);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)in_RDI,__args);
  ValidationReport::~ValidationReport(in_RDI);
  std::allocator<char>::~allocator(&local_141);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }